

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestMissingSubNinja::Run(ParserTestMissingSubNinja *this)

{
  Test *pTVar1;
  bool bVar2;
  string err;
  ManifestParser parser;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  ManifestParser local_70;
  
  ManifestParser::ManifestParser
            (&local_70,&(this->super_ParserTest).state,(FileReader *)&(this->super_ParserTest).fs_,
             (ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"subninja foo.ninja\n",&local_b1);
  bVar2 = ManifestParser::ParseTest(&local_70,&local_90,&local_b0);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
             ,0x380,"parser.ParseTest(\"subninja foo.ninja\\n\", &err)");
  std::__cxx11::string::~string((string *)&local_90);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:1: loading \'foo.ninja\': No such file or directory\nsubninja foo.ninja\n                  ^ near here"
                          ,&local_b0);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
             ,900,
             "\"input:1: loading \'foo.ninja\': No such file or directory\\n\" \"subninja foo.ninja\\n\" \"                  ^ near here\" == err"
            );
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

TEST_F(ParserTest, MissingSubNinja) {
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_FALSE(parser.ParseTest("subninja foo.ninja\n", &err));
  EXPECT_EQ("input:1: loading 'foo.ninja': No such file or directory\n"
            "subninja foo.ninja\n"
            "                  ^ near here"
            , err);
}